

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O2

void __thiscall Hpipe::InstructionGraph::make_init(InstructionGraph *this)

{
  uint index;
  PendingTrans *pt_00;
  Instruction *pIVar1;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *pdVar2;
  _Elt_pointer pPVar3;
  InstructionSkip *this_00;
  CharItem *pCVar4;
  Instruction *pIVar5;
  size_type sVar6;
  PendingTrans *pt;
  PendingTrans *__args;
  deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
  *this_01;
  PendingTrans *pPVar7;
  deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
  *this_02;
  _Map_pointer local_258;
  InstructionRewind *rw_1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  pending_trans_mark;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  loc_pending_trans;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  pending_trans;
  deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> pending_rewinds;
  Context local_a0;
  
  std::_Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
  _Deque_base(&pending_rewinds.
               super__Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
             );
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::_Deque_base(&pending_trans.
                 super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               );
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::_Deque_base(&pending_trans_mark.
                 super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               );
  this_00 = (InstructionSkip *)operator_new(0x178);
  pCVar4 = CharGraph::root(this->cg);
  Context::Context(&local_a0,pCVar4,1);
  InstructionSkip::Instruction(this_00,&local_a0);
  pIVar5 = &PtrPool<Hpipe::Instruction,32>::operator<<
                      ((PtrPool<Hpipe::Instruction,32> *)&this->inst_pool,this_00)->
            super_Instruction;
  this->init = pIVar5;
  Context::~Context(&local_a0);
  rw_1 = (InstructionRewind *)((ulong)rw_1._4_4_ << 0x20);
  pIVar5 = this->init;
  pCVar4 = CharGraph::root(this->cg);
  Context::forward((PC *)&loc_pending_trans,&pIVar5->cx,pCVar4,this->never_ending);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
  ::emplace_back<Hpipe::Instruction*&,int,std::pair<Hpipe::Context,Hpipe::Vec<unsigned_int>>>
            ((deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
              *)&pending_trans,&this->init,(int *)&rw_1,
             (pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)&loc_pending_trans);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair
            ((pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)&loc_pending_trans);
  while( true ) {
    sVar6 = std::
            deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            ::size(&pending_trans);
    if (((sVar6 == 0) &&
        (sVar6 = std::
                 deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                 ::size(&pending_trans_mark), sVar6 == 0)) &&
       (sVar6 = std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                ::size(&pending_rewinds), sVar6 == 0)) break;
    if ((pending_trans.
         super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
         pending_trans.
         super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) &&
       (pending_trans_mark.
        super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        pending_trans_mark.
        super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
      while (sVar6 = std::
                     deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                     ::size(&pending_rewinds), sVar6 != 0) {
        loc_pending_trans.
        super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
        ._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             *pending_rewinds.
              super__Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
        std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
        pop_front(&pending_rewinds);
        make_rewind_data(this,(InstructionRewind *)
                              loc_pending_trans.
                              super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                              ._M_impl.super__Deque_impl_data._M_map);
        rw_1 = (InstructionRewind *)((ulong)rw_1 & 0xffffffff00000000);
        std::
        deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
        ::
        emplace_back<Hpipe::InstructionRewind*&,int,std::pair<Hpipe::Context,Hpipe::Vec<unsigned_int>>&>
                  ((deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                    *)&pending_trans,
                   (InstructionRewind **)
                   &loc_pending_trans.
                    super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                   ,(int *)&rw_1,
                   (pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)
                   (loc_pending_trans.
                    super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                    ._M_impl.super__Deque_impl_data._M_map + 0x3a));
      }
    }
    else {
      sVar6 = std::
              deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
              ::size(&pending_trans_mark);
      this_02 = (deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                 *)&pending_trans_mark;
      if (sVar6 == 0) {
        this_02 = (deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                   *)&pending_trans;
      }
      pdVar2 = &pending_trans_mark;
      if (sVar6 == 0) {
        pdVar2 = &pending_trans;
      }
      pt_00 = (pdVar2->
              super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
              )._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::
      _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::_Deque_base(&loc_pending_trans.
                     super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                   );
      pIVar5 = make_transitions(this,(deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                                      *)&loc_pending_trans.
                                         super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                                ,pt_00);
      pPVar3 = loc_pending_trans.
               super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_258 = loc_pending_trans.
                  super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
      __args = loc_pending_trans.
               super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pPVar7 = loc_pending_trans.
               super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      while (__args != pPVar3) {
        this_01 = (deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                   *)&pending_trans;
        if ((__args->cx).mark != (InstructionMark *)0x0) {
          this_01 = (deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                     *)&pending_trans_mark;
        }
        std::
        deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
        ::emplace_back<Hpipe::InstructionGraph::PendingTrans>
                  ((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                    *)this_01,__args);
        __args = __args + 1;
        if (__args == pPVar7) {
          __args = local_258[1];
          local_258 = local_258 + 1;
          pPVar7 = __args + 3;
        }
      }
      if ((pIVar5 != (Instruction *)0x0) &&
         (rw_1 = (InstructionRewind *)
                 __dynamic_cast(pIVar5,&Instruction::typeinfo,&InstructionRewind::typeinfo,0),
         rw_1 != (InstructionRewind *)0x0)) {
        std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
        push_back(&pending_rewinds,&rw_1);
      }
      pIVar1 = pt_00->inst;
      index = pt_00->num_edge;
      Transition::Transition((Transition *)&rw_1,pIVar5,&pt_00->rcitem,-1.0);
      Vec<Hpipe::Transition>::secure_set(&pIVar1->next,index,(Transition *)&rw_1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_238);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Instruction*&,Hpipe::Vec<unsigned_int>&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar5->prev,
                 &pt_00->inst,&pt_00->rcitem);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::pop_front((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                   *)this_02);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::~deque(&loc_pending_trans);
    }
  }
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::~deque(&pending_trans_mark);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::~deque(&pending_trans);
  std::_Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
  ~_Deque_base(&pending_rewinds.
                super__Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
              );
  return;
}

Assistant:

void InstructionGraph::make_init() {
    // as much as possible, we try to move forward without cycles (to avoid miss of possible "free mark")
    std::deque<InstructionRewind *> pending_rewinds;
    std::deque<PendingTrans> pending_trans, pending_trans_mark;
    init = inst_pool << new InstructionSkip( Context( cg->root(), Context::FL_BEG ) );

    // first transition
    pending_trans.emplace_back( init, 0, init->cx.forward( cg->root(), never_ending ) );

    // make all the remaining transitions
    while ( pending_trans.size() || pending_trans_mark.size() || pending_rewinds.size() ) {
        // if only rewinds => make rewind data (exec, ncx, ...) and add the new transitions
        if ( pending_trans.empty() && pending_trans_mark.empty() ) {
            while ( pending_rewinds.size() ) {
                InstructionRewind *rw = pending_rewinds.front();
                pending_rewinds.pop_front();
                make_rewind_data( rw );

                pending_trans.emplace_back( rw, 0, rw->ncx );
            }
            continue;
        }

        //
        std::deque<PendingTrans> &pt_list = pending_trans_mark.size() ? pending_trans_mark : pending_trans;
        PendingTrans &pt = pt_list.front();

        // make instruction with associated new pending transitions
        std::deque<PendingTrans> loc_pending_trans;
        Instruction *inst = make_transitions( loc_pending_trans, pt );
        for( PendingTrans &pt : loc_pending_trans )
            ( pt.cx.mark ? pending_trans_mark : pending_trans ).push_back( std::move( pt ) );
        if ( InstructionRewind *rw = dynamic_cast<InstructionRewind *>( inst ) )
            pending_rewinds.push_back( rw );

        // insert it into the graph
        pt.inst->next.secure_set( pt.num_edge, { inst, pt.rcitem } );
        inst->prev.emplace_back( pt.inst, pt.rcitem );

        //
        pt_list.pop_front();
    }
}